

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O1

void createSimpleFeatureVectorizerModel
               (Model *spec,char *outputName,ArrayFeatureType_ArrayDataType arrayType,int inputSize)

{
  RepeatedField<long> *this;
  int iVar1;
  Rep *pRVar2;
  TreeEnsembleClassifier *pTVar3;
  StringVector *pSVar4;
  RepeatedPtrFieldBase *pRVar5;
  ArrayFeatureType_ArrayDataType AVar6;
  char *pcVar7;
  Model *pMVar8;
  uint uVar9;
  uint uVar10;
  ModelDescription *pMVar11;
  Metadata *pMVar12;
  FeatureType *pFVar13;
  DoubleFeatureType *pDVar14;
  long *plVar15;
  FeatureDescription *pFVar16;
  ArrayFeatureType *pAVar17;
  FeatureVectorizer *pFVar18;
  FeatureVectorizer_InputColumn *obj;
  void *pvVar19;
  ulong uVar20;
  long *plVar21;
  undefined8 *puVar22;
  Arena *pAVar23;
  uint uVar24;
  Arena *pAVar25;
  long tmp;
  uint uVar26;
  string __str;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70 [2];
  long local_60 [2];
  RepeatedPtrFieldBase *local_50;
  ArrayFeatureType_ArrayDataType local_44;
  char *local_40;
  Model *local_38;
  
  spec->specificationversion_ = 9;
  if (spec->description_ == (ModelDescription *)0x0) {
    uVar20 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar20 & 0xfffffffffffffffc);
    if ((uVar20 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pMVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar25);
    spec->description_ = pMVar11;
  }
  pMVar11 = spec->description_;
  if (pMVar11->metadata_ == (Metadata *)0x0) {
    uVar20 = (pMVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar20 & 0xfffffffffffffffc);
    if ((uVar20 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pMVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Metadata>(pAVar25);
    pMVar11->metadata_ = pMVar12;
  }
  pMVar12 = pMVar11->metadata_;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Testing serialization","");
  uVar20 = (pMVar12->super_MessageLite)._internal_metadata_.ptr_;
  puVar22 = (undefined8 *)(uVar20 & 0xfffffffffffffffc);
  if ((uVar20 & 1) != 0) {
    puVar22 = (undefined8 *)*puVar22;
  }
  google::protobuf::internal::ArenaStringPtr::Set(&pMVar12->shortdescription_,&local_90,puVar22);
  local_44 = arrayType;
  local_40 = outputName;
  local_38 = spec;
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (0 < inputSize) {
    local_50 = &(pMVar11->input_).super_RepeatedPtrFieldBase;
    uVar26 = 0;
    do {
      pRVar5 = local_50;
      pRVar2 = (pMVar11->input_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar2 == (Rep *)0x0) {
LAB_00204260:
        pFVar16 = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::FeatureDescription>(local_50->arena_);
        pvVar19 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (pRVar5,pFVar16);
      }
      else {
        iVar1 = (pMVar11->input_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar2->allocated_size <= iVar1) goto LAB_00204260;
        (pMVar11->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pvVar19 = pRVar2->elements[iVar1];
      }
      pFVar13 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar13,(Arena *)0x0,false);
      if (pFVar13->_oneof_case_[0] != 2) {
        CoreML::Specification::FeatureType::clear_Type(pFVar13);
        pFVar13->_oneof_case_[0] = 2;
        uVar20 = (pFVar13->super_MessageLite)._internal_metadata_.ptr_;
        pAVar25 = (Arena *)(uVar20 & 0xfffffffffffffffc);
        if ((uVar20 & 1) != 0) {
          pAVar25 = *(Arena **)pAVar25;
        }
        pDVar14 = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::DoubleFeatureType>(pAVar25);
        (pFVar13->Type_).doubletype_ = pDVar14;
      }
      uVar24 = 1;
      if (9 < uVar26) {
        uVar20 = (ulong)uVar26;
        uVar9 = 4;
        do {
          uVar24 = uVar9;
          uVar10 = (uint)uVar20;
          if (uVar10 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_0020430d;
          }
          if (uVar10 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_0020430d;
          }
          if (uVar10 < 10000) goto LAB_0020430d;
          uVar20 = uVar20 / 10000;
          uVar9 = uVar24 + 4;
        } while (99999 < uVar10);
        uVar24 = uVar24 + 1;
      }
LAB_0020430d:
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar24);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70[0],uVar24,uVar26);
      plVar15 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x3cb973);
      local_90 = &local_80;
      plVar21 = plVar15 + 2;
      if ((long *)*plVar15 == plVar21) {
        local_80 = *plVar21;
        uStack_78 = (undefined4)plVar15[3];
        uStack_74 = *(undefined4 *)((long)plVar15 + 0x1c);
      }
      else {
        local_80 = *plVar21;
        local_90 = (long *)*plVar15;
      }
      local_88 = plVar15[1];
      *plVar15 = (long)plVar21;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      puVar22 = (undefined8 *)(*(ulong *)((long)pvVar19 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar19 + 8) & 1) != 0) {
        puVar22 = (undefined8 *)*puVar22;
      }
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)((long)pvVar19 + 0x10),&local_90,puVar22);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      pAVar25 = (Arena *)(*(ulong *)((long)pvVar19 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar19 + 8) & 1) != 0) {
        pAVar25 = *(Arena **)pAVar25;
      }
      if ((pAVar25 == (Arena *)0x0) && (*(long **)((long)pvVar19 + 0x20) != (long *)0x0)) {
        (**(code **)(**(long **)((long)pvVar19 + 0x20) + 8))();
      }
      pAVar23 = (Arena *)(pFVar13->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar23 & 2) == 0) {
        if (((ulong)pAVar23 & 1) != 0) {
          pAVar23 = *(Arena **)((ulong)pAVar23 & 0xfffffffffffffffc);
        }
      }
      else {
        pAVar23 = (Arena *)0x0;
      }
      if (pAVar25 != pAVar23) {
        pFVar13 = (FeatureType *)
                  google::protobuf::internal::GetOwnedMessageInternal
                            (pAVar25,(MessageLite *)pFVar13,pAVar23);
      }
      *(FeatureType **)((long)pvVar19 + 0x20) = pFVar13;
      uVar26 = uVar26 + 1;
    } while (uVar26 != inputSize);
  }
  pRVar2 = (pMVar11->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar1 = (pMVar11->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      (pMVar11->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar19 = pRVar2->elements[iVar1];
      goto LAB_002044b4;
    }
  }
  pFVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                      ((pMVar11->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar19 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pMVar11->output_).super_RepeatedPtrFieldBase,pFVar16);
LAB_002044b4:
  pFVar13 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar13,(Arena *)0x0,false);
  if (pFVar13->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar13);
    pFVar13->_oneof_case_[0] = 5;
    uVar20 = (pFVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar20 & 0xfffffffffffffffc);
    if ((uVar20 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pAVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar25);
    (pFVar13->Type_).multiarraytype_ = pAVar17;
  }
  pAVar17 = (pFVar13->Type_).multiarraytype_;
  this = &pAVar17->shape_;
  uVar26 = (pAVar17->shape_).current_size_;
  uVar24 = (pAVar17->shape_).total_size_;
  if (uVar26 == uVar24) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar24 + 1);
  }
  plVar15 = google::protobuf::RepeatedField<long>::elements(this);
  pcVar7 = local_40;
  AVar6 = local_44;
  plVar15[uVar26] = (long)inputSize;
  this->current_size_ = uVar26 + 1;
  if (pFVar13->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar13);
    pFVar13->_oneof_case_[0] = 5;
    uVar20 = (pFVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar20 & 0xfffffffffffffffc);
    if ((uVar20 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pAVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar25);
    (pFVar13->Type_).multiarraytype_ = pAVar17;
  }
  ((pFVar13->Type_).multiarraytype_)->datatype_ = AVar6;
  puVar22 = (undefined8 *)(*(ulong *)((long)pvVar19 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar19 + 8) & 1) != 0) {
    puVar22 = (undefined8 *)*puVar22;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar19 + 0x10),pcVar7,puVar22);
  pAVar25 = (Arena *)(*(ulong *)((long)pvVar19 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar19 + 8) & 1) != 0) {
    pAVar25 = *(Arena **)pAVar25;
  }
  if ((pAVar25 == (Arena *)0x0) && (*(long **)((long)pvVar19 + 0x20) != (long *)0x0)) {
    (**(code **)(**(long **)((long)pvVar19 + 0x20) + 8))();
  }
  pAVar23 = (Arena *)(pFVar13->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pAVar23 & 2) == 0) {
    if (((ulong)pAVar23 & 1) != 0) {
      pAVar23 = *(Arena **)((ulong)pAVar23 & 0xfffffffffffffffc);
    }
  }
  else {
    pAVar23 = (Arena *)0x0;
  }
  if (pAVar25 != pAVar23) {
    pFVar13 = (FeatureType *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (pAVar25,(MessageLite *)pFVar13,pAVar23);
  }
  pMVar8 = local_38;
  *(FeatureType **)((long)pvVar19 + 0x20) = pFVar13;
  if (local_38->_oneof_case_[0] != 0x25a) {
    CoreML::Specification::Model::clear_Type(local_38);
    pMVar8->_oneof_case_[0] = 0x25a;
    uVar20 = (pMVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar25 = (Arena *)(uVar20 & 0xfffffffffffffffc);
    if ((uVar20 & 1) != 0) {
      pAVar25 = *(Arena **)pAVar25;
    }
    pFVar18 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureVectorizer>
                        (pAVar25);
    (pMVar8->Type_).featurevectorizer_ = pFVar18;
  }
  if (0 < inputSize) {
    pTVar3 = (pMVar8->Type_).treeensembleclassifier_;
    local_50 = (RepeatedPtrFieldBase *)&pTVar3->treeensemble_;
    uVar26 = 0;
    do {
      pRVar5 = local_50;
      pSVar4 = (pTVar3->ClassLabels_).stringclasslabels_;
      if (pSVar4 == (StringVector *)0x0) {
LAB_00204669:
        obj = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::FeatureVectorizer_InputColumn>
                        (local_50->arena_);
        pvVar19 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper(pRVar5,obj);
      }
      else {
        iVar1 = pTVar3->postevaluationtransform_;
        if (*(int *)&(pSVar4->super_MessageLite)._vptr_MessageLite <= iVar1) goto LAB_00204669;
        pTVar3->postevaluationtransform_ = iVar1 + 1;
        pvVar19 = (void *)(&(pSVar4->super_MessageLite)._internal_metadata_)[iVar1].ptr_;
      }
      uVar24 = 1;
      if (9 < uVar26) {
        uVar20 = (ulong)uVar26;
        uVar9 = 4;
        do {
          uVar24 = uVar9;
          uVar10 = (uint)uVar20;
          if (uVar10 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_002046d2;
          }
          if (uVar10 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_002046d2;
          }
          if (uVar10 < 10000) goto LAB_002046d2;
          uVar20 = uVar20 / 10000;
          uVar9 = uVar24 + 4;
        } while (99999 < uVar10);
        uVar24 = uVar24 + 1;
      }
LAB_002046d2:
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar24);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70[0],uVar24,uVar26);
      plVar15 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x3cb973);
      plVar21 = plVar15 + 2;
      if ((long *)*plVar15 == plVar21) {
        local_80 = *plVar21;
        uStack_78 = (undefined4)plVar15[3];
        uStack_74 = *(undefined4 *)((long)plVar15 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar21;
        local_90 = (long *)*plVar15;
      }
      local_88 = plVar15[1];
      *plVar15 = (long)plVar21;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      puVar22 = (undefined8 *)(*(ulong *)((long)pvVar19 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar19 + 8) & 1) != 0) {
        puVar22 = (undefined8 *)*puVar22;
      }
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)((long)pvVar19 + 0x10),&local_90,puVar22);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      *(undefined8 *)((long)pvVar19 + 0x18) = 1;
      uVar26 = uVar26 + 1;
    } while (uVar26 != inputSize);
  }
  return;
}

Assistant:

void createSimpleFeatureVectorizerModel(Specification::Model *spec, const char *outputName, Specification::ArrayFeatureType_ArrayDataType arrayType, int inputSize) {
    
    spec->set_specificationversion(MLMODEL_SPECIFICATION_VERSION);
    
    auto interface = spec->mutable_description();
    auto metadata = interface->mutable_metadata();
    metadata->set_shortdescription(std::string("Testing serialization"));
    
    for (int d = 0; d < inputSize; d++) {
        auto input = interface->add_input();
        auto inputType = new Specification::FeatureType;
        inputType->mutable_doubletype();
        input->set_name("input" + std::to_string(d));
        input->set_allocated_type(inputType);
    }
    
    auto output = interface->add_output();
    auto outputType = new Specification::FeatureType;
    outputType->mutable_multiarraytype()->mutable_shape()->Add(inputSize);
    outputType->mutable_multiarraytype()->set_datatype(arrayType);
    output->set_name(outputName);
    output->set_allocated_type(outputType);
    
    auto featurVectorizerModel = spec->mutable_featurevectorizer();
    
    for (int d = 0; d < inputSize; d++) {
        auto inputlist = featurVectorizerModel->add_inputlist();
        inputlist->set_inputcolumn("input" + std::to_string(d));
        inputlist->set_inputdimensions(1);
    }
    
}